

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.cc
# Opt level: O3

void __thiscall bsplib::Bsmp::sync(Bsmp *this)

{
  pointer *pppVar1;
  ostringstream *this_00;
  pointer ppVar2;
  iterator __position;
  pointer puVar3;
  void *__dest;
  void *__dest_00;
  unsigned_long uVar4;
  exception *peVar5;
  int iVar6;
  char in_SIL;
  ulong extra_bytes;
  A2A *a2a;
  long lVar7;
  size_t tag_size;
  size_t size;
  size_t counter;
  char local_209;
  unsigned_long local_208;
  unsigned_long local_200;
  unsigned_long local_1f8;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1f0;
  AlignedBuf *local_1e8;
  AlignedBuf *local_1e0;
  A2A *local_1d8;
  exception local_1d0;
  
  ppVar2 = (this->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_payloads).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  (this->m_tag_buffer).m_size = 0;
  (this->m_payload_buffer).m_size = 0;
  if (in_SIL == '\0') {
    a2a = &this->m_a2a;
    if (0 < (this->m_a2a).m_nprocs) {
      iVar6 = 0;
      do {
        serial<unsigned_int>(a2a,iVar6,0);
        serial<unsigned_long>(a2a,iVar6,this->m_set_tag_size_counter);
        serial<unsigned_long>(a2a,iVar6,this->m_next_tag_size);
        iVar6 = iVar6 + 1;
      } while (iVar6 < (this->m_a2a).m_nprocs);
    }
    A2A::exchange(a2a);
    this->m_total_n_messages = 0;
    this->m_total_payload = 0;
    if (0 < (this->m_a2a).m_nprocs) {
      local_1f0 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                   *)&this->m_payloads;
      local_1e0 = &this->m_tag_buffer;
      local_1e8 = &this->m_payload_buffer;
      lVar7 = 0;
      local_1d8 = a2a;
      do {
        while( true ) {
          iVar6 = (int)lVar7;
          deserial<unsigned_long>(a2a,iVar6,&local_200);
          if (local_200 == 0) break;
          extra_bytes = local_200 - 1;
          __dest = AlignedBuf::append(local_1e0,this->m_send_tag_size);
          local_1d0._0_8_ = (this->m_payload_buffer).m_size;
          __position._M_current =
               (this->m_payloads).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1d0._8_8_ = extra_bytes;
          if (__position._M_current ==
              (this->m_payloads).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      (local_1f0,__position,(pair<unsigned_long,_unsigned_long> *)&local_1d0);
          }
          else {
            (__position._M_current)->first = local_1d0._0_8_;
            (__position._M_current)->second = extra_bytes;
            pppVar1 = &(this->m_payloads).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          __dest_00 = AlignedBuf::append(local_1e8,extra_bytes);
          memcpy(__dest,(this->m_a2a).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        (this->m_a2a).m_recv_pos.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] + (this->m_a2a).m_recv_cap * lVar7,
                 this->m_send_tag_size);
          puVar3 = (this->m_a2a).m_recv_pos.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = puVar3[lVar7];
          if (this->m_send_tag_size <=
              (this->m_a2a).m_recv_sizes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] - uVar4) {
            uVar4 = uVar4 + this->m_send_tag_size;
            puVar3[lVar7] = uVar4;
          }
          memcpy(__dest_00,
                 (this->m_a2a).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar4 + (this->m_a2a).m_recv_cap * lVar7,
                 extra_bytes);
          puVar3 = (this->m_a2a).m_recv_pos.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = puVar3[lVar7];
          if (extra_bytes <=
              (this->m_a2a).m_recv_sizes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] - uVar4) {
            puVar3[lVar7] = uVar4 + extra_bytes;
          }
          this->m_total_n_messages = this->m_total_n_messages + 1;
          this->m_total_payload = extra_bytes + this->m_total_payload;
          a2a = local_1d8;
        }
        local_1f8 = 0xffffffffffffffff;
        deserial<unsigned_long>(a2a,iVar6,&local_1f8);
        if (local_1f8 != this->m_set_tag_size_counter) {
          peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_set_tagsize");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,
                     "Not all processes set the tag size same number of times\n",0x38);
          exception::exception(peVar5,&local_1d0);
          __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
        }
        local_208 = 0xffffffffffffffff;
        deserial<unsigned_long>(a2a,iVar6,&local_208);
        if (local_208 != this->m_next_tag_size) {
          peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_set_tagsize");
          this_00 = &local_1d0.m_stream;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Not all processes announced the same tag size\n",0x2e);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  -> process ",0xd)
          ;
          std::ostream::operator<<((ostream *)this_00,(this->m_a2a).m_pid);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          local_209 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_209,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  -> process ",0xd)
          ;
          std::ostream::operator<<((ostream *)this_00,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          local_209 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_209,1);
          exception::exception(peVar5,&local_1d0);
          __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->m_a2a).m_nprocs);
    }
  }
  this->m_send_empty = true;
  this->m_recv_tag_size = this->m_send_tag_size;
  this->m_send_tag_size = this->m_next_tag_size;
  this->m_set_tag_size_counter = 0;
  return;
}

Assistant:

void Bsmp::sync( bool dummy ) 
{
    m_payloads.clear();
    m_tag_buffer.clear();
    m_payload_buffer.clear();

    if (!dummy) {
#ifdef PROFILE
    TicToc t( TicToc::BSMP);
#endif

    const unsigned marker = 0;
    for (int p = 0; p < m_a2a.nprocs(); ++p ) {
        serial( m_a2a, p, marker );
        serial( m_a2a, p, m_set_tag_size_counter );
        serial( m_a2a, p, m_next_tag_size );
    
#ifdef PROFILE
        t.add_bytes( m_a2a.send_size(p) );
#endif
    }

    m_a2a.exchange( );

    m_total_n_messages = 0; 
    m_total_payload = 0;
    for (int p = 0 ; p < m_a2a.nprocs(); ++p )
    {
        size_t size;
        while ( deserial( m_a2a, p, size ), size != marker ) {
            size_t payload_size = size - 1;

            void * tag = m_tag_buffer.append( m_send_tag_size );
            m_payloads.push_back(
                    std::make_pair( m_payload_buffer.size(), payload_size ) 
                    );
            void * payload = m_payload_buffer.append( payload_size );
          
            std::memcpy( tag, m_a2a.recv_top(p), m_send_tag_size );
            m_a2a.recv_pop(p, m_send_tag_size );
            std::memcpy( payload, m_a2a.recv_top(p), payload_size );
            m_a2a.recv_pop(p, payload_size );

            m_total_n_messages += 1;
            m_total_payload += payload_size;
        }

        size_t counter = size_t(-1);
        deserial( m_a2a, p, counter );
        if (counter != m_set_tag_size_counter )
            throw exception("bsp_set_tagsize") 
                << "Not all processes set the tag size same number of times\n";

        size_t tag_size = size_t(-1);
        deserial( m_a2a, p, tag_size );
        if (tag_size != m_next_tag_size)
            throw exception("bsp_set_tagsize") 
                << "Not all processes announced the same tag size\n"
                << "  -> process " << m_a2a.pid() 
                                   << " got " << m_next_tag_size << '\n'
                << "  -> process " << p << " got " << tag_size << '\n';
    } 
    } // if (!dummy)
    
    m_send_empty = true;

    // update tag size
    m_recv_tag_size = m_send_tag_size;
    m_send_tag_size = m_next_tag_size;
    m_set_tag_size_counter = 0;
}